

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessageFactory::TypeInfo::~TypeInfo(TypeInfo *this)

{
  MessageLite *pMVar1;
  Reflection *this_00;
  uint *puVar2;
  Descriptor *pDVar3;
  
  pMVar1 = (this->class_data).super_ClassData.prototype;
  if (pMVar1 != (MessageLite *)0x0) {
    (*pMVar1->_vptr_MessageLite[1])();
  }
  this_00 = (this->class_data).reflection;
  if (this_00 != (Reflection *)0x0) {
    Reflection::~Reflection(this_00);
  }
  operator_delete(this_00,0x70);
  puVar2 = (this->offsets)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  pDVar3 = (this->class_data).descriptor;
  if (puVar2 != (uint *)0x0) {
    std::__fill_n_a<unsigned_int*,int,unsigned_int>(puVar2,pDVar3->field_count_);
  }
  puVar2 = (this->has_bits_indices)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  if (puVar2 != (uint *)0x0) {
    std::__fill_n_a<unsigned_int*,int,unsigned_int>(puVar2,pDVar3->field_count_);
  }
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            (&this->has_bits_indices);
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&this->offsets)
  ;
  return;
}

Assistant:

~TypeInfo() {
    delete class_data.prototype;
    delete class_data.reflection;

    auto* type = class_data.descriptor;

    // Scribble the payload to prevent unsanitized opt builds from silently
    // allowing use-after-free bugs where the factory is destroyed but the
    // DynamicMessage instances are still used.
    // This is a common bug with DynamicMessageFactory.
    // NOTE: This must happen after deleting the prototype.
    if (offsets != nullptr) {
      std::fill_n(offsets.get(), type->field_count(), 0xCDCDCDCDu);
    }
    if (has_bits_indices != nullptr) {
      std::fill_n(has_bits_indices.get(), type->field_count(), 0xCDCDCDCDu);
    }
  }